

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

uint32_t lzma_mf_find(lzma_mf *mf,uint32_t *count_ptr,lzma_match *matches)

{
  uint32_t uVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  bool bVar5;
  uint local_44;
  uint32_t limit;
  uint8_t *p2;
  uint8_t *p1;
  uint32_t local_28;
  uint32_t i;
  uint32_t len_best;
  uint32_t count;
  lzma_match *matches_local;
  uint32_t *count_ptr_local;
  lzma_mf *mf_local;
  
  uVar1 = (*mf->find)(mf,matches);
  local_28 = 0;
  if (uVar1 != 0) {
    for (p1._4_4_ = 0; p1._4_4_ < uVar1; p1._4_4_ = p1._4_4_ + 1) {
      if (mf->nice_len < matches[p1._4_4_].len) {
        __assert_fail("matches[i].len <= mf->nice_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x26,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
      if (mf->read_pos <= matches[p1._4_4_].dist) {
        __assert_fail("matches[i].dist < mf->read_pos",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x27,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
      puVar3 = mf_ptr(mf);
      puVar4 = mf_ptr(mf);
      iVar2 = memcmp(puVar3 + -1,puVar4 + (-2 - (ulong)matches[p1._4_4_].dist),
                     (ulong)matches[p1._4_4_].len);
      if (iVar2 != 0) {
        __assert_fail("memcmp(mf_ptr(mf) - 1, mf_ptr(mf) - matches[i].dist - 2, matches[i].len) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x2a,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
    }
    local_28 = matches[uVar1 - 1].len;
    if (local_28 == mf->nice_len) {
      local_44 = mf_avail(mf);
      local_44 = local_44 + 1;
      if (mf->match_len_max < local_44) {
        local_44 = mf->match_len_max;
      }
      puVar3 = mf_ptr(mf);
      while( true ) {
        bVar5 = false;
        if (local_28 < local_44) {
          bVar5 = puVar3[(ulong)local_28 - 1] ==
                  puVar3[(ulong)local_28 + (-2 - (ulong)matches[uVar1 - 1].dist)];
        }
        if (!bVar5) break;
        local_28 = local_28 + 1;
      }
    }
  }
  *count_ptr = uVar1;
  mf->read_ahead = mf->read_ahead + 1;
  return local_28;
}

Assistant:

extern uint32_t
lzma_mf_find(lzma_mf *mf, uint32_t *count_ptr, lzma_match *matches)
{
	// Call the match finder. It returns the number of length-distance
	// pairs found.
	// FIXME: Minimum count is zero, what _exactly_ is the maximum?
	const uint32_t count = mf->find(mf, matches);

	// Length of the longest match; assume that no matches were found
	// and thus the maximum length is zero.
	uint32_t len_best = 0;

	if (count > 0) {
#ifndef NDEBUG
		uint32_t i;
		// Validate the matches.
		for (i = 0; i < count; ++i) {
			assert(matches[i].len <= mf->nice_len);
			assert(matches[i].dist < mf->read_pos);
			assert(memcmp(mf_ptr(mf) - 1,
				mf_ptr(mf) - matches[i].dist - 2,
				matches[i].len) == 0);
		}
#endif

		// The last used element in the array contains
		// the longest match.
		len_best = matches[count - 1].len;

		// If a match of maximum search length was found, try to
		// extend the match to maximum possible length.
		if (len_best == mf->nice_len) {
			uint8_t *p1;
			uint8_t *p2;

			// The limit for the match length is either the
			// maximum match length supported by the LZ-based
			// encoder or the number of bytes left in the
			// dictionary, whichever is smaller.
			uint32_t limit = mf_avail(mf) + 1;
			if (limit > mf->match_len_max)
				limit = mf->match_len_max;

			// Pointer to the byte we just ran through
			// the match finder.
			p1 = mf_ptr(mf) - 1;

			// Pointer to the beginning of the match. We need -1
			// here because the match distances are zero based.
			p2 = p1 - matches[count - 1].dist - 1;

			while (len_best < limit
					&& p1[len_best] == p2[len_best])
				++len_best;
		}
	}

	*count_ptr = count;

	// Finally update the read position to indicate that match finder was
	// run for this dictionary offset.
	++mf->read_ahead;

	return len_best;
}